

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCModule.c
# Opt level: O3

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  code *pcVar1;
  int iVar2;
  
  iVar2 = 5;
  if ((*(uint *)(ctx + 4) & 0x7fffff8f) == 0) {
    MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
    ARM_init(MRI);
    iVar2 = 0;
    ARM_getRegName((cs_struct *)ctx,0);
    *(code **)(ctx + 8) = ARM_printInst;
    *(MCRegisterInfo **)(ctx + 0x10) = MRI;
    *(code **)(ctx + 0x30) = ARM_reg_name;
    *(code **)(ctx + 0x48) = ARM_get_insn_id;
    *(code **)(ctx + 0x38) = ARM_insn_name;
    *(code **)(ctx + 0x40) = ARM_group_name;
    *(code **)(ctx + 0x50) = ARM_post_printer;
    if (((byte)ctx[4] & 0x10) == 0) {
      pcVar1 = ARM_getInstruction;
    }
    else {
      pcVar1 = Thumb_getInstruction;
    }
    *(code **)(ctx + 0x18) = pcVar1;
  }
  return iVar2;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 |
				CS_MODE_BIG_ENDIAN))
		return CS_ERR_MODE;

	mri = (MCRegisterInfo *) cs_mem_malloc(sizeof(*mri));

	PPC_init(mri);
	ud->printer = PPC_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = PPC_getInstruction;
	ud->post_printer = PPC_post_printer;

	ud->reg_name = PPC_reg_name;
	ud->insn_id = PPC_get_insn_id;
	ud->insn_name = PPC_insn_name;
	ud->group_name = PPC_group_name;

	return CS_ERR_OK;
}